

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_CutDsdBalancePinDelays_rec
              (If_DsdMan_t *p,int Id,int *pTimes,word *pRes,int *pnSupp,int nSuppAll,char *pPermLits
              )

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  word *pwVar11;
  word wVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int pCounter [15];
  word pFaninRes [15];
  int local_e8 [12];
  ulong auStack_b8 [17];
  
  if ((Id < 0) || ((p->vObjs).nSize <= Id)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar2 = (int *)(p->vObjs).pArray[(uint)Id];
  switch(piVar2[1] & 7) {
  case 2:
    iVar5 = *pnSupp;
    *pnSupp = iVar5 + 1;
    bVar7 = pPermLits[iVar5];
    if ((char)bVar7 < '\0') {
LAB_00426db2:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (0x1f < bVar7) {
      __assert_fail("v >= 0 && v < 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                    ,0x92,"word If_CutPinDelayInit(int)");
    }
    uVar16 = (uint)bVar7 * 2 & 0xfffffffc;
    *pRes = 1L << ((byte)uVar16 & 0x3f);
    iVar5 = *(int *)((long)pTimes + (ulong)uVar16);
    break;
  case 3:
  case 4:
    uVar16 = 0;
    if ((uint)piVar2[1] < 0x8000000) {
      iVar5 = 0;
      uVar16 = 0;
    }
    else {
      uVar17 = piVar2[2];
      iVar5 = 0;
      if (uVar17 != 0) {
        uVar16 = 0;
        uVar19 = 0;
        do {
          if ((int)uVar17 < 0) goto LAB_00426db2;
          iVar5 = If_CutDsdBalancePinDelays_rec
                            (p,uVar17 >> 1,pTimes,auStack_b8 + uVar19 + 2,pnSupp,nSuppAll,pPermLits)
          ;
          uVar9 = (ulong)(int)uVar16;
          auStack_b8[uVar9 + 2] = auStack_b8[uVar19 + 2];
          uVar17 = uVar16 + 1;
          local_e8[uVar9] = iVar5;
          bVar4 = 0 < (int)uVar16;
          uVar16 = uVar17;
          if (bVar4) {
            do {
              uVar14 = uVar9 & 0xffffffff;
              iVar5 = local_e8[uVar14];
              uVar13 = uVar9 - 1 & 0xffffffff;
              iVar1 = local_e8[uVar13];
              if (iVar5 < iVar1) break;
              iVar6 = (int)uVar9;
              if (iVar1 < iVar5) {
                local_e8[uVar14] = iVar1;
                local_e8[uVar13] = iVar5;
                uVar15 = auStack_b8[uVar14 + 2];
                auStack_b8[uVar14 + 2] = auStack_b8[uVar13 + 2];
                auStack_b8[uVar13 + 2] = uVar15;
              }
              else {
                local_e8[uVar13] = iVar1 + 1;
                if (nSuppAll < 1) {
                  uVar15 = 0;
                }
                else {
                  if (nSuppAll - 0x11U < 0xfffffff0) goto LAB_00426d93;
                  lVar8 = 0;
                  uVar15 = 0;
                  do {
                    bVar7 = (byte)lVar8;
                    uVar10 = (uint)(auStack_b8[uVar14 + 2] >> (bVar7 & 0x3f)) & 0xf;
                    uVar17 = (uint)(auStack_b8[uVar13 + 2] >> (bVar7 & 0x3f)) & 0xf;
                    if (uVar17 < uVar10) {
                      uVar17 = uVar10;
                    }
                    if (uVar17 != 0) {
                      uVar18 = (ulong)uVar17;
                      if (0xd < uVar17) {
                        uVar18 = 0xe;
                      }
                      uVar15 = uVar15 | uVar18 + 1 << (bVar7 & 0x3f);
                    }
                    lVar8 = lVar8 + 4;
                  } while ((ulong)(uint)nSuppAll << 2 != lVar8);
                }
                auStack_b8[uVar13 + 2] = uVar15;
                uVar16 = uVar16 - 1;
                if (iVar6 < (int)uVar16) {
                  lVar8 = 0;
                  do {
                    local_e8[uVar14 + lVar8] = local_e8[uVar14 + lVar8 + 1];
                    auStack_b8[uVar14 + lVar8 + 2] = auStack_b8[uVar14 + lVar8 + 3];
                    lVar8 = lVar8 + 1;
                  } while ((int)lVar8 + iVar6 < (int)uVar16);
                }
              }
              uVar9 = uVar9 - 1;
            } while (1 < iVar6);
          }
          if ((int)uVar16 < 1) {
            __assert_fail("nTimes > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                          ,0xe2,
                          "int If_LogCounterPinDelays(int *, int *, word *, int, word, int, int)");
          }
        } while ((uVar19 + 1 < (ulong)((uint)piVar2[1] >> 0x1b)) &&
                (uVar17 = piVar2[uVar19 + 3], uVar19 = uVar19 + 1, uVar17 != 0));
        iVar5 = local_e8[0] + (uint)(uVar16 != 1);
      }
    }
    if ((int)uVar16 < 1) {
      __assert_fail("nCounter > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x880,
                    "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                   );
    }
    if (uVar16 != 1) {
      uVar19 = (ulong)uVar16;
      do {
        if (nSuppAll < 1) {
          uVar9 = 0;
        }
        else {
          if (nSuppAll - 0x11U < 0xfffffff0) goto LAB_00426d93;
          lVar8 = 0;
          uVar9 = 0;
          do {
            bVar7 = (byte)lVar8;
            uVar17 = (uint)(auStack_b8[uVar19 + 1] >> (bVar7 & 0x3f)) & 0xf;
            uVar16 = (uint)(auStack_b8[uVar19] >> (bVar7 & 0x3f)) & 0xf;
            if (uVar16 < uVar17) {
              uVar16 = uVar17;
            }
            if (uVar16 != 0) {
              uVar14 = (ulong)uVar16;
              if (0xd < uVar16) {
                uVar14 = 0xe;
              }
              uVar9 = uVar9 | uVar14 + 1 << (bVar7 & 0x3f);
            }
            lVar8 = lVar8 + 4;
          } while ((ulong)(uint)nSuppAll << 2 != lVar8);
        }
        auStack_b8[uVar19] = uVar9;
        bVar4 = 2 < (long)uVar19;
        uVar19 = uVar19 - 1;
      } while (bVar4);
    }
    *pRes = auStack_b8[2];
    break;
  case 5:
    if (0x7ffffff < (uint)piVar2[1]) {
      pwVar11 = auStack_b8 + 2;
      uVar19 = 0;
      do {
        uVar16 = piVar2[uVar19 + 2];
        if (uVar16 == 0) break;
        if ((int)uVar16 < 0) goto LAB_00426db2;
        iVar5 = If_CutDsdBalancePinDelays_rec
                          (p,uVar16 >> 1,pTimes,pwVar11,pnSupp,nSuppAll,pPermLits);
        local_e8[uVar19] = iVar5;
        uVar19 = uVar19 + 1;
        pwVar11 = pwVar11 + 1;
      } while (uVar19 < (uint)piVar2[1] >> 0x1b);
    }
    uVar19 = (ulong)(uint)nSuppAll;
    if (nSuppAll < 1) {
      uVar9 = 0;
    }
    else {
      if (nSuppAll - 0x11U < 0xfffffff0) goto LAB_00426d93;
      lVar8 = 0;
      uVar9 = 0;
      do {
        bVar7 = (byte)lVar8;
        uVar17 = (uint)(auStack_b8[2] >> (bVar7 & 0x3f)) & 0xf;
        uVar16 = (uint)(auStack_b8[3] >> (bVar7 & 0x3f)) & 0xf;
        if (uVar16 < uVar17) {
          uVar16 = uVar17;
        }
        if (uVar16 != 0) {
          if (0xd < uVar16) {
            uVar16 = 0xe;
          }
          uVar9 = uVar9 | (ulong)uVar16 + 1 << (bVar7 & 0x3f);
        }
        lVar8 = lVar8 + 4;
      } while (uVar19 * 4 - lVar8 != 0);
    }
    if (nSuppAll < 1) {
      uVar14 = 0;
    }
    else {
      if (nSuppAll - 0x11U < 0xfffffff0) goto LAB_00426d93;
      lVar8 = 0;
      uVar14 = 0;
      do {
        bVar7 = (byte)lVar8;
        uVar17 = (uint)(auStack_b8[2] >> (bVar7 & 0x3f)) & 0xf;
        uVar16 = (uint)(auStack_b8[4] >> (bVar7 & 0x3f)) & 0xf;
        if (uVar16 < uVar17) {
          uVar16 = uVar17;
        }
        if (uVar16 != 0) {
          if (0xd < uVar16) {
            uVar16 = 0xe;
          }
          uVar14 = uVar14 | (ulong)uVar16 + 1 << (bVar7 & 0x3f);
        }
        lVar8 = lVar8 + 4;
      } while (uVar19 * 4 - lVar8 != 0);
    }
    if (nSuppAll < 1) {
      wVar12 = 0;
    }
    else {
      if (nSuppAll - 0x11U < 0xfffffff0) {
LAB_00426d93:
        __assert_fail("v >= 0 && v < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                      ,0x90,"int If_CutPinDelayGet(word, int)");
      }
      lVar8 = 0;
      wVar12 = 0;
      do {
        bVar7 = (byte)lVar8;
        uVar17 = (uint)(uVar9 >> (bVar7 & 0x3f)) & 0xf;
        uVar16 = (uint)(uVar14 >> (bVar7 & 0x3f)) & 0xf;
        if (uVar16 < uVar17) {
          uVar16 = uVar17;
        }
        if (uVar16 != 0) {
          if (0xd < uVar16) {
            uVar16 = 0xe;
          }
          wVar12 = wVar12 | (ulong)uVar16 + 1 << (bVar7 & 0x3f);
        }
        lVar8 = lVar8 + 4;
      } while (uVar19 << 2 != lVar8);
    }
    *pRes = wVar12;
    if (local_e8[2] < local_e8[1]) {
      local_e8[2] = local_e8[1];
    }
    if (local_e8[2] < local_e8[0]) {
      local_e8[2] = local_e8[0];
    }
    iVar5 = local_e8[2] + 2;
    break;
  case 6:
    uVar16 = piVar2[1];
    uVar17 = 0xffffffff;
    if (0x17ffffff < uVar16 && (uVar16 & 7) == 6) {
      iVar5 = *piVar2;
      if (((long)iVar5 < 0) || ((p->vTruths).nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar17 = (p->vTruths).pArray[iVar5];
    }
    if (((int)uVar17 < 0) || (p->vIsops[uVar16 >> 0x1b]->nSize <= (int)uVar17)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar3 = p->vIsops[uVar16 >> 0x1b]->pArray;
    if (pVVar3[uVar17].nSize < 1) {
      __assert_fail("Vec_IntSize(vCover) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x870,
                    "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                   );
    }
    if (0x7ffffff < (uint)piVar2[1]) {
      pwVar11 = auStack_b8 + 2;
      uVar19 = 0;
      do {
        uVar16 = piVar2[uVar19 + 2];
        if (uVar16 == 0) break;
        if ((int)uVar16 < 0) goto LAB_00426db2;
        iVar5 = If_CutDsdBalancePinDelays_rec
                          (p,uVar16 >> 1,pTimes,pwVar11,pnSupp,nSuppAll,pPermLits);
        local_e8[uVar19] = iVar5;
        uVar19 = uVar19 + 1;
        pwVar11 = pwVar11 + 1;
      } while (uVar19 < (uint)piVar2[1] >> 0x1b);
    }
    iVar5 = If_CutSopBalancePinDelaysInt(pVVar3 + uVar17,local_e8,auStack_b8 + 2,nSuppAll,pRes);
    break;
  default:
    __assert_fail("If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x875,
                  "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                 );
  }
  return iVar5;
}

Assistant:

int If_CutDsdBalancePinDelays_rec( If_DsdMan_t * p, int Id, int * pTimes, word * pRes, int * pnSupp, int nSuppAll, char * pPermLits )
{
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iCutVar = Abc_Lit2Var(pPermLits[(*pnSupp)++]);
        *pRes = If_CutPinDelayInit(iCutVar);
        return pTimes[iCutVar];
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        word pFaninRes[3], Res0, Res1;
        int i, iFanin, Delays[3];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            Delays[i] = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
        Res0 = If_CutPinDelayMax( pFaninRes[0], pFaninRes[1], nSuppAll, 1 );
        Res1 = If_CutPinDelayMax( pFaninRes[0], pFaninRes[2], nSuppAll, 1 );
        *pRes = If_CutPinDelayMax( Res0, Res1, nSuppAll, 1 );
        return 2 + Abc_MaxInt(Delays[0], Abc_MaxInt(Delays[1], Delays[2]));
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
    {
        word pFaninRes[IF_MAX_FUNC_LUTSIZE];
        int i, iFanin, Delays[IF_MAX_FUNC_LUTSIZE];
        Vec_Int_t * vCover = Vec_WecEntry( p->vIsops[pObj->nFans], If_DsdObjTruthId(p, pObj) );
        assert( Vec_IntSize(vCover) > 0 );
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            Delays[i] = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
        return If_CutSopBalancePinDelaysInt( vCover, Delays, pFaninRes, nSuppAll, pRes );
    }
    assert( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR );
    {
        word pFaninRes[IF_MAX_FUNC_LUTSIZE];
        int i, iFanin, Delay, Result = 0;
        int fXor = 0;//(If_DsdObjType(pObj) == IF_DSD_XOR);
        int nCounter = 0, pCounter[IF_MAX_FUNC_LUTSIZE];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delay = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
            Result = If_LogCounterPinDelays( pCounter, &nCounter, pFaninRes, Delay, pFaninRes[i], nSuppAll, fXor );
        }
        assert( nCounter > 0 );
        if ( fXor )
            Result = If_LogCounterDelayXor( pCounter, nCounter ); // estimation
        *pRes = If_LogPinDelaysMulti( pFaninRes, nCounter, nSuppAll, fXor );
        return Result;
    }
}